

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

int VectorMismatch_C(uint32_t *array1,uint32_t *array2,int length)

{
  ulong uVar1;
  ulong uVar2;
  
  if (length < 1) {
    return 0;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (array1[uVar1] != array2[uVar1]) break;
    uVar1 = uVar1 + 1;
    uVar2 = (ulong)(uint)length;
  } while ((uint)length != uVar1);
  return (int)uVar2;
}

Assistant:

static int VectorMismatch_C(const uint32_t* const array1,
                            const uint32_t* const array2, int length) {
  int match_len = 0;

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}